

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

size_t __thiscall Potassco::EnumClass::convert(EnumClass *this,char *x,int *out)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  size_t sVar4;
  int cVal;
  char *next;
  StringSpan k;
  int local_4c;
  char *local_48;
  StringSpan local_40;
  
  iVar2 = Potassco::xconvert(x,&local_4c,&local_48,in_ECX);
  if ((iVar2 != 0) && (bVar1 = isValid(this,local_4c), bVar1)) {
    *out = local_4c;
    return (long)local_48 - (long)x;
  }
  if (local_48 == x) {
    sVar3 = strcspn(x," ,=");
    local_40.first = x;
    local_40.size = sVar3;
    bVar1 = detail::find_kv(this,&local_40,(int *)0x0,(StringSpan *)0x0,out);
    sVar4 = 0;
    if (bVar1) {
      sVar4 = sVar3;
    }
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

size_t EnumClass::convert(const char* x, int& out) const {
	int cVal; const char* next;
	if (xconvert(x, cVal, &next, ',') && isValid(cVal)) {
		out = cVal;
		return static_cast<size_t>(next - x);
	}
	else if (x == next) {
		StringSpan k = toSpan(x, std::strcspn(x, " ,="));
		return detail::find_kv(*this, &k, 0, 0, &out) ? k.size : 0;
	}
	else { return static_cast<size_t>(0); }
}